

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *w)

{
  int iVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *u;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&local_a0);
  u = this->m_elem;
  for (iVar1 = this->memused; 0 < iVar1; iVar1 = iVar1 + -1) {
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,(cpp_dec_float<50U,_int,_void> *)u,
               &(w->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[u->idx].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_a0,&local_68);
    u = u + 1;
  }
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       local_a0.data._M_elems._32_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       local_a0.data._M_elems._16_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       local_a0.data._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_a0.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       local_a0.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = local_a0.exp;
  (__return_storage_ptr__->m_backend).neg = local_a0.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_a0.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_a0.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

inline
R SVectorBase<R>::operator*(const VectorBase<R>& w) const
{
   StableSum<R> x;
   Nonzero<R>* e = m_elem;

   for(int i = size() - 1; i >= 0; --i)
   {
      x += e->val * w[e->idx];
      e++;
   }

   return x;
}